

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

char * Ptr_HopToType(Abc_Obj_t *pObj)

{
  word wVar1;
  char *pcVar2;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x36,"char *Ptr_HopToType(Abc_Obj_t *)");
  }
  wVar1 = Hop_ManComputeTruth6
                    ((Hop_Man_t *)pObj->pNtk->pManFunc,(Hop_Obj_t *)(pObj->field_5).pData,
                     (pObj->vFanins).nSize);
  if ((long)wVar1 < 0) {
    if ((long)wVar1 < -0x5555555555555556) {
      if (wVar1 == 0x8888888888888888) {
        pcVar2 = "AndT";
      }
      else {
        if (wVar1 != 0x9999999999999999) {
LAB_003928b3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                        ,0x4e,"char *Ptr_HopToType(Abc_Obj_t *)");
        }
        pcVar2 = "XnorT";
      }
    }
    else if (wVar1 == 0xaaaaaaaaaaaaaaaa) {
      pcVar2 = "BufT";
    }
    else if (wVar1 == 0xeeeeeeeeeeeeeeee) {
      pcVar2 = "OrT";
    }
    else {
      if (wVar1 != 0xffffffffffffffff) goto LAB_003928b3;
      pcVar2 = "Const1T";
    }
  }
  else if ((long)wVar1 < 0x5555555555555555) {
    if (wVar1 == 0) {
      pcVar2 = "Const0T";
    }
    else {
      if (wVar1 != 0x1111111111111111) goto LAB_003928b3;
      pcVar2 = "NorT";
    }
  }
  else if (wVar1 == 0x5555555555555555) {
    pcVar2 = "InvT";
  }
  else if (wVar1 == 0x6666666666666666) {
    pcVar2 = "XorT";
  }
  else {
    if (wVar1 != 0x7777777777777777) goto LAB_003928b3;
    pcVar2 = "NandT";
  }
  return pcVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Node type conversions.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Ptr_HopToType( Abc_Obj_t * pObj )
{
    static word uTruth, uTruths6[3] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
    };
    assert( Abc_ObjIsNode(pObj) );
    uTruth = Hop_ManComputeTruth6( (Hop_Man_t *)Abc_ObjNtk(pObj)->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj) );
/*
    if ( uTruth ==  0 )                           return "BAC_BOX_C0";
    if ( uTruth == ~(word)0 )                     return "BAC_BOX_C1";
    if ( uTruth ==  uTruths6[0] )                 return "BAC_BOX_BUF";
    if ( uTruth == ~uTruths6[0] )                 return "BAC_BOX_INV";
    if ( uTruth == (uTruths6[0] & uTruths6[1]) )  return "BAC_BOX_AND";
    if ( uTruth ==~(uTruths6[0] & uTruths6[1]) )  return "BAC_BOX_NAND";
    if ( uTruth == (uTruths6[0] | uTruths6[1]) )  return "BAC_BOX_OR";
    if ( uTruth ==~(uTruths6[0] | uTruths6[1]) )  return "BAC_BOX_NOR";
    if ( uTruth == (uTruths6[0] ^ uTruths6[1]) )  return "BAC_BOX_XOR";
    if ( uTruth ==~(uTruths6[0] ^ uTruths6[1]) )  return "BAC_BOX_XNOR";
*/
    if ( uTruth ==  0 )                           return "Const0T";
    if ( uTruth == ~(word)0 )                     return "Const1T";
    if ( uTruth ==  uTruths6[0] )                 return "BufT";
    if ( uTruth == ~uTruths6[0] )                 return "InvT";
    if ( uTruth == (uTruths6[0] & uTruths6[1]) )  return "AndT";
    if ( uTruth ==~(uTruths6[0] & uTruths6[1]) )  return "NandT";
    if ( uTruth == (uTruths6[0] | uTruths6[1]) )  return "OrT";
    if ( uTruth ==~(uTruths6[0] | uTruths6[1]) )  return "NorT";
    if ( uTruth == (uTruths6[0] ^ uTruths6[1]) )  return "XorT";
    if ( uTruth ==~(uTruths6[0] ^ uTruths6[1]) )  return "XnorT";
    assert( 0 );
    return NULL;
}